

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O2

const_varint_iterator<long> * __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this)

{
  if (this->m_data != (char *)0x0) {
    skip_varint(&this->m_data,this->m_end);
    return this;
  }
  __assert_fail("m_data",
                "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/include/protozero/iterators.hpp"
                ,0x159,
                "const_varint_iterator<T> &protozero::const_varint_iterator<long>::operator++() [T = long]"
               );
}

Assistant:

const_varint_iterator& operator++() {
        protozero_assert(m_data);
        skip_varint(&m_data, m_end);
        return *this;
    }